

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O2

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  Module *wasm;
  string_view sVar1;
  Type TVar2;
  Call *pCVar3;
  Block *pBVar4;
  ulong extraout_RDX;
  Index index;
  ulong uVar5;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  initializer_list<wasm::Expression_*> __l_01;
  optional<wasm::Type> type;
  PassOptions local_270;
  undefined1 local_1b8 [8];
  PassRunner runner;
  string local_a0;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  LocalGet *local_50;
  LocalSet *local_48;
  Builder local_40;
  Builder builder;
  
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
         ).super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.currModule;
    auStack_78 = (undefined1  [8])0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80 = Function::getNumParams(func);
    uVar5 = 0;
    while (index = (Index)uVar5, uVar5 < local_80) {
      TVar2 = Function::getLocalType(func,index);
      if (TVar2.id == 4) {
        sVar1 = (this->deNan32).super_IString.str;
        local_50 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        local_50->index = index;
        (local_50->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 4;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_50;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b8,__l,
                   (allocator_type *)((long)&builder.wasm + 7));
        pCVar3 = Builder::makeCall(&local_40,(Name)sVar1,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)local_1b8,(Type)0x4,false);
        local_48 = Builder::makeLocalSet(&local_40,index,(Expression *)pCVar3);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                   (Expression **)&local_48);
LAB_009d6479:
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   local_1b8);
      }
      else {
        TVar2 = Function::getLocalType(func,index);
        if (TVar2.id == 5) {
          sVar1 = (this->deNan64).super_IString.str;
          local_50 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
          local_50->index = index;
          (local_50->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 5
          ;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_50;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b8,
                     __l_00,(allocator_type *)((long)&builder.wasm + 7));
          pCVar3 = Builder::makeCall(&local_40,(Name)sVar1,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)local_1b8,(Type)0x5,false);
          local_48 = Builder::makeLocalSet(&local_40,index,(Expression *)pCVar3);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                     (Expression **)&local_48);
          goto LAB_009d6479;
        }
        TVar2 = Function::getLocalType(func,index);
        if (TVar2.id == 6) {
          sVar1 = (this->deNan128).super_IString.str;
          local_50 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
          local_50->index = index;
          (local_50->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 6
          ;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_50;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b8,
                     __l_01,(allocator_type *)((long)&builder.wasm + 7));
          pCVar3 = Builder::makeCall(&local_40,(Name)sVar1,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)local_1b8,(Type)0x6,false);
          local_48 = Builder::makeLocalSet(&local_40,index,(Expression *)pCVar3);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                     (Expression **)&local_48);
          goto LAB_009d6479;
        }
      }
      uVar5 = (ulong)(index + 1);
    }
    if (auStack_78 !=
        (undefined1  [8])
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78,
                 &func->body);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX
      ;
      pBVar4 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         (&local_40,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_78,type);
      func->body = (Expression *)pBVar4;
      wasm = (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
             ).
             super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
             .super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             currModule;
      PassOptions::PassOptions
                (&local_270,
                 &((this->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                   ).super_Pass.runner)->options);
      PassRunner::PassRunner((PassRunner *)local_1b8,wasm,&local_270);
      PassOptions::~PassOptions(&local_270);
      runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"merge-blocks",(allocator<char> *)&local_48);
      PassRunner::add((PassRunner *)local_1b8,&local_a0,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&runner.isNested);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&runner.isNested);
      std::__cxx11::string::~string((string *)&local_a0);
      PassRunner::run((PassRunner *)local_1b8);
      PassRunner::~PassRunner((PassRunner *)local_1b8);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      } else if (func->getLocalType(i) == Type::v128) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan128, {builder.makeLocalGet(i, Type::v128)}, Type::v128)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }